

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O3

int bucket_insert(bucket b,void *key,void *value)

{
  pair ppVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  char *message;
  
  if ((key == (void *)0x0 || b == (bucket)0x0) || value == (void *)0x0) {
    message = "Invalid bucket insert parameters";
    sVar4 = 0xf2;
LAB_00117c97:
    log_write_impl_va("metacall",sVar4,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,message);
    iVar2 = 1;
  }
  else {
    if (b->pairs == (pair)0x0) {
      iVar2 = bucket_alloc_pairs(b,4);
      if (iVar2 != 0) {
        message = "Invalid bucket insertion pairs allocation";
        sVar4 = 0xf8;
        goto LAB_00117c97;
      }
    }
    sVar4 = b->count;
    uVar3 = sVar4 + 1;
    if (b->capacity <= uVar3) {
      iVar2 = bucket_realloc_pairs(b,b->capacity * 2);
      if (iVar2 != 0) {
        message = "Invalid bucket insertion pairs reallocation";
        sVar4 = 0x100;
        goto LAB_00117c97;
      }
      sVar4 = b->count;
      uVar3 = sVar4 + 1;
    }
    ppVar1 = b->pairs;
    ppVar1[sVar4].key = key;
    ppVar1[sVar4].value = value;
    b->count = uVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bucket_insert(bucket b, void *key, void *value)
{
	pair p;

	if (b == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insert parameters");
		return 1;
	}

	if (b->pairs == NULL && bucket_alloc_pairs(b, BUCKET_PAIRS_DEFAULT) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs allocation");
		return 1;
	}

	if ((b->count + 1) >= b->capacity)
	{
		if (bucket_realloc_pairs(b, b->capacity << 1) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs reallocation");
			return 1;
		}
	}

	p = &b->pairs[b->count];

	p->key = key;
	p->value = value;

	++b->count;

	return 0;
}